

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaf.hpp
# Opt level: O1

optional<metaf::Pressure> metaf::Pressure::fromQfeString(string *s)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  optional<metaf::Pressure> oVar7;
  
  uVar1 = s->_M_string_length;
  if ((((uVar1 == 0xb) || (uVar1 == 6)) && (pcVar2 = (s->_M_dataplus)._M_p, *pcVar2 == 'Q')) &&
     ((pcVar2[1] == 'F' && (pcVar2[2] == 'E')))) {
    uVar6 = 0;
    if (5 < uVar1) {
      lVar5 = 0;
      do {
        if ((byte)(pcVar2[lVar5 + 3] - 0x3aU) < 0xf6) {
          uVar4 = 0;
          uVar6 = 0;
          goto LAB_001b1cbf;
        }
        uVar4 = (uint)(byte)(pcVar2[lVar5 + 3] - 0x30) + (int)uVar6 * 10;
        uVar6 = (ulong)uVar4;
        lVar5 = lVar5 + 1;
      } while ((int)lVar5 != 3);
      uVar6 = 0x100000000;
LAB_001b1cbf:
      uVar6 = uVar4 | uVar6;
    }
    if ((uVar6 & 0x100000000) != 0) {
      if (uVar1 == 0xb) {
        lVar5 = 0;
        do {
          lVar3 = lVar5 + 7;
          if (9 < (byte)(pcVar2[lVar3] - 0x30U)) goto LAB_001b1ccb;
          lVar5 = lVar5 + 1;
        } while ((int)lVar5 != 4);
        if ((9 < (byte)(pcVar2[lVar3] - 0x30U)) || (pcVar2[6] != '/')) goto LAB_001b1ccb;
      }
      oVar7.super__Optional_base<metaf::Pressure,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::Pressure>._8_8_ = 0x100000002;
      oVar7.super__Optional_base<metaf::Pressure,_true,_true>._M_payload.
      super__Optional_payload_base<metaf::Pressure>._M_payload._M_value.pressureValue.
      super__Optional_base<float,_true,_true>._M_payload.super__Optional_payload_base<float> =
           (optional<float>)
           (optional<float>)((ulong)(uint)(float)(uVar6 & 0xffffffff) | 0x100000000);
      return (optional<metaf::Pressure>)
             oVar7.super__Optional_base<metaf::Pressure,_true,_true>._M_payload.
             super__Optional_payload_base<metaf::Pressure>;
    }
  }
LAB_001b1ccb:
  return (_Optional_base<metaf::Pressure,_true,_true>)ZEXT816(0x100000000);
}

Assistant:

std::optional<Pressure> Pressure::fromQfeString(const std::string & s) {
	//static const std::regex rgx("QFE(\\d\\d\\d)(/\\d\\d\\d\\d)?");
	static const std::optional<Pressure> error;
	if (s.length() != 6 && s.length() != 11) return error;
	if (s[0] != 'Q' || s[1] != 'F' || s[2] != 'E') return error;
	const auto mmHg = strToUint(s, 3, 3);
	if (!mmHg.has_value()) return error;
	if (s.length() == 11) {
		const auto hPa = strToUint(s, 7, 4);
		if (!hPa.has_value() || s[6] != '/') return error;
		//Value in hPa is ignored (parsed only for group syntax check)
	}
	Pressure pressure;
	pressure.pressureUnit = Unit::MM_HG;
	pressure.pressureValue = *mmHg;
	return pressure;
}